

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_get_unordered_multiset_Test::~ObjectTest_basic_get_unordered_multiset_Test
          (ObjectTest_basic_get_unordered_multiset_Test *this)

{
  ObjectTest_basic_get_unordered_multiset_Test *this_local;
  
  ~ObjectTest_basic_get_unordered_multiset_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_unordered_multiset) {
	object obj;

	EXPECT_TRUE(obj.get<std::unordered_multiset<bool>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<short>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<int>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<long long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<float>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<long double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_multiset<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<object>>().empty());
}